

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.h
# Opt level: O0

void __thiscall
QOpenGLFunctions::glFramebufferTexture2D
          (QOpenGLFunctions *this,GLenum target,GLenum attachment,GLenum textarget,GLuint texture,
          GLint level)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  
  (**(code **)(*in_RDI + 0x250))(in_ESI,in_EDX,in_ECX,in_R8D,in_R9D);
  return;
}

Assistant:

inline void QOpenGLFunctions::glFramebufferTexture2D(GLenum target, GLenum attachment, GLenum textarget, GLuint texture, GLint level)
{
#if QT_CONFIG(opengles2) && defined(Q_OS_ANDROID)
    ::glFramebufferTexture2D(target, attachment, textarget, texture, level);
#else
    Q_ASSERT(QOpenGLFunctions::isInitialized(d_ptr));
    d_ptr->f.FramebufferTexture2D(target, attachment, textarget, texture, level);
#endif
    Q_OPENGL_FUNCTIONS_DEBUG
}